

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

rcode __thiscall
olc::Platform_Linux::CreateWindowPane
          (Platform_Linux *this,vi2d *vWindowPos,vi2d *vWindowSize,bool bFullScreen)

{
  Display *pDVar1;
  XVisualInfo *pXVar2;
  Colormap CVar3;
  Window WVar4;
  mapped_type *pmVar5;
  key_type local_4c8 [100];
  undefined1 local_1a8 [8];
  XWindowAttributes gwa;
  XEvent xev;
  Atom fullscreen;
  Atom wm_state;
  Atom wmDelete;
  GLint olc_GLAttribs [5];
  bool bFullScreen_local;
  vi2d *vWindowSize_local;
  vi2d *vWindowPos_local;
  Platform_Linux *this_local;
  
  XInitThreads();
  pDVar1 = (Display *)XOpenDisplay(0);
  this->olc_Display = pDVar1;
  this->olc_WindowRoot =
       *(Window *)
        (*(long *)(this->olc_Display + 0xe8) + (long)*(int *)(this->olc_Display + 0xe0) * 0x80 +
        0x10);
  wmDelete = 0xc00000004;
  olc_GLAttribs[0] = 0x18;
  olc_GLAttribs[1] = 5;
  olc_GLAttribs[2] = 0;
  pXVar2 = (XVisualInfo *)glXChooseVisual(this->olc_Display,0,&wmDelete);
  this->olc_VisualInfo = pXVar2;
  CVar3 = XCreateColormap(this->olc_Display,this->olc_WindowRoot,this->olc_VisualInfo->visual,0);
  this->olc_ColourMap = CVar3;
  (this->olc_SetWindowAttribs).colormap = this->olc_ColourMap;
  (this->olc_SetWindowAttribs).event_mask = 0x22804f;
  WVar4 = XCreateWindow(this->olc_Display,this->olc_WindowRoot,vWindowPos->x,vWindowPos->y,
                        vWindowSize->x,vWindowSize->y,0,this->olc_VisualInfo->depth,1,
                        this->olc_VisualInfo->visual,0x2800,&this->olc_SetWindowAttribs);
  this->olc_Window = WVar4;
  wm_state = XInternAtom(this->olc_Display,"WM_DELETE_WINDOW",1);
  XSetWMProtocols(this->olc_Display,this->olc_Window,&wm_state,1);
  XMapWindow(this->olc_Display,this->olc_Window);
  XStoreName(this->olc_Display,this->olc_Window,"OneLoneCoder.com - Pixel Game Engine");
  if (bFullScreen) {
    XInternAtom(this->olc_Display,"_NET_WM_STATE",0);
    XInternAtom(this->olc_Display,"_NET_WM_STATE_FULLSCREEN",0);
    memset(&gwa.screen,0,0xc0);
    gwa.screen._0_4_ = 0x21;
    XMapWindow(this->olc_Display,this->olc_Window);
    XSendEvent(this->olc_Display,
               *(undefined8 *)
                (*(long *)(this->olc_Display + 0xe8) +
                 (long)*(int *)(this->olc_Display + 0xe0) * 0x80 + 0x10),0,0x180000,&gwa.screen);
    XFlush(this->olc_Display);
    XGetWindowAttributes(this->olc_Display,this->olc_Window,local_1a8);
    vWindowSize->x = gwa.x;
    vWindowSize->y = gwa.y;
  }
  local_4c8[99] = 0;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 99);
  *pmVar5 = '\0';
  local_4c8[0x62] = 0x61;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x62);
  *pmVar5 = '\x01';
  local_4c8[0x61] = 0x62;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x61);
  *pmVar5 = '\x02';
  local_4c8[0x60] = 99;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x60);
  *pmVar5 = '\x03';
  local_4c8[0x5f] = 100;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x5f);
  *pmVar5 = '\x04';
  local_4c8[0x5e] = 0x65;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x5e);
  *pmVar5 = '\x05';
  local_4c8[0x5d] = 0x66;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x5d);
  *pmVar5 = '\x06';
  local_4c8[0x5c] = 0x67;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x5c);
  *pmVar5 = '\a';
  local_4c8[0x5b] = 0x68;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x5b);
  *pmVar5 = '\b';
  local_4c8[0x5a] = 0x69;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x5a);
  *pmVar5 = '\t';
  local_4c8[0x59] = 0x6a;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x59);
  *pmVar5 = '\n';
  local_4c8[0x58] = 0x6b;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x58);
  *pmVar5 = '\v';
  local_4c8[0x57] = 0x6c;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x57);
  *pmVar5 = '\f';
  local_4c8[0x56] = 0x6d;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x56);
  *pmVar5 = '\r';
  local_4c8[0x55] = 0x6e;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x55);
  *pmVar5 = '\x0e';
  local_4c8[0x54] = 0x6f;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x54);
  *pmVar5 = '\x0f';
  local_4c8[0x53] = 0x70;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x53);
  *pmVar5 = '\x10';
  local_4c8[0x52] = 0x71;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x52);
  *pmVar5 = '\x11';
  local_4c8[0x51] = 0x72;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x51);
  *pmVar5 = '\x12';
  local_4c8[0x50] = 0x73;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x50);
  *pmVar5 = '\x13';
  local_4c8[0x4f] = 0x74;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x4f);
  *pmVar5 = '\x14';
  local_4c8[0x4e] = 0x75;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x4e);
  *pmVar5 = '\x15';
  local_4c8[0x4d] = 0x76;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x4d);
  *pmVar5 = '\x16';
  local_4c8[0x4c] = 0x77;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x4c);
  *pmVar5 = '\x17';
  local_4c8[0x4b] = 0x78;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x4b);
  *pmVar5 = '\x18';
  local_4c8[0x4a] = 0x79;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x4a);
  *pmVar5 = '\x19';
  local_4c8[0x49] = 0x7a;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x49);
  *pmVar5 = '\x1a';
  local_4c8[0x48] = 0xffbe;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x48);
  *pmVar5 = '%';
  local_4c8[0x47] = 0xffbf;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x47);
  *pmVar5 = '&';
  local_4c8[0x46] = 0xffc0;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x46);
  *pmVar5 = '\'';
  local_4c8[0x45] = 0xffc1;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x45);
  *pmVar5 = '(';
  local_4c8[0x44] = 0xffc2;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x44);
  *pmVar5 = ')';
  local_4c8[0x43] = 0xffc3;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x43);
  *pmVar5 = '*';
  local_4c8[0x42] = 0xffc4;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x42);
  *pmVar5 = '+';
  local_4c8[0x41] = 0xffc5;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x41);
  *pmVar5 = ',';
  local_4c8[0x40] = 0xffc6;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x40);
  *pmVar5 = '-';
  local_4c8[0x3f] = 0xffc7;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x3f);
  *pmVar5 = '.';
  local_4c8[0x3e] = 0xffc8;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x3e);
  *pmVar5 = '/';
  local_4c8[0x3d] = 0xffc9;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x3d);
  *pmVar5 = '0';
  local_4c8[0x3c] = 0xff54;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x3c);
  *pmVar5 = '2';
  local_4c8[0x3b] = 0xff51;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x3b);
  *pmVar5 = '3';
  local_4c8[0x3a] = 0xff53;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x3a);
  *pmVar5 = '4';
  local_4c8[0x39] = 0xff52;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x39);
  *pmVar5 = '1';
  local_4c8[0x38] = 0xff8d;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x38);
  *pmVar5 = 'B';
  local_4c8[0x37] = 0xff0d;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x37);
  *pmVar5 = 'B';
  local_4c8[0x36] = 0xff08;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x36);
  *pmVar5 = '?';
  local_4c8[0x35] = 0xff1b;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x35);
  *pmVar5 = '@';
  local_4c8[0x34] = 0xff0a;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x34);
  *pmVar5 = 'B';
  local_4c8[0x33] = 0xff13;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x33);
  *pmVar5 = 'C';
  local_4c8[0x32] = 0xff14;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x32);
  *pmVar5 = 'D';
  local_4c8[0x31] = 0xff09;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x31);
  *pmVar5 = '6';
  local_4c8[0x30] = 0xffff;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x30);
  *pmVar5 = ':';
  local_4c8[0x2f] = 0xff50;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x2f);
  *pmVar5 = ';';
  local_4c8[0x2e] = 0xff57;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x2e);
  *pmVar5 = '<';
  local_4c8[0x2d] = 0xff55;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x2d);
  *pmVar5 = '=';
  local_4c8[0x2c] = 0xff56;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x2c);
  *pmVar5 = '>';
  local_4c8[0x2b] = 0xff63;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x2b);
  *pmVar5 = '9';
  local_4c8[0x2a] = 0xffe1;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x2a);
  *pmVar5 = '7';
  local_4c8[0x29] = 0xffe2;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x29);
  *pmVar5 = '7';
  local_4c8[0x28] = 0xffe3;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x28);
  *pmVar5 = '8';
  local_4c8[0x27] = 0xffe4;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x27);
  *pmVar5 = '8';
  local_4c8[0x26] = 0x20;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x26);
  *pmVar5 = '5';
  local_4c8[0x25] = 0x2e;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x25);
  *pmVar5 = 'T';
  local_4c8[0x24] = 0x30;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x24);
  *pmVar5 = '\x1b';
  local_4c8[0x23] = 0x31;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x23);
  *pmVar5 = '\x1c';
  local_4c8[0x22] = 0x32;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x22);
  *pmVar5 = '\x1d';
  local_4c8[0x21] = 0x33;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x21);
  *pmVar5 = '\x1e';
  local_4c8[0x20] = 0x34;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x20);
  *pmVar5 = '\x1f';
  local_4c8[0x1f] = 0x35;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x1f);
  *pmVar5 = ' ';
  local_4c8[0x1e] = 0x36;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x1e);
  *pmVar5 = '!';
  local_4c8[0x1d] = 0x37;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x1d);
  *pmVar5 = '\"';
  local_4c8[0x1c] = 0x38;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x1c);
  *pmVar5 = '#';
  local_4c8[0x1b] = 0x39;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x1b);
  *pmVar5 = '$';
  local_4c8[0x1a] = 0xffb0;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x1a);
  *pmVar5 = 'E';
  local_4c8[0x19] = 0xffb1;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x19);
  *pmVar5 = 'F';
  local_4c8[0x18] = 0xffb2;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x18);
  *pmVar5 = 'G';
  local_4c8[0x17] = 0xffb3;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x17);
  *pmVar5 = 'H';
  local_4c8[0x16] = 0xffb4;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x16);
  *pmVar5 = 'I';
  local_4c8[0x15] = 0xffb5;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x15);
  *pmVar5 = 'J';
  local_4c8[0x14] = 0xffb6;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x14);
  *pmVar5 = 'K';
  local_4c8[0x13] = 0xffb7;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x13);
  *pmVar5 = 'L';
  local_4c8[0x12] = 0xffb8;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x12);
  *pmVar5 = 'M';
  local_4c8[0x11] = 0xffb9;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x11);
  *pmVar5 = 'N';
  local_4c8[0x10] = 0xffaa;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0x10);
  *pmVar5 = 'O';
  local_4c8[0xf] = 0xffab;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0xf);
  *pmVar5 = 'Q';
  local_4c8[0xe] = 0xffaf;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0xe);
  *pmVar5 = 'P';
  local_4c8[0xd] = 0xffad;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0xd);
  *pmVar5 = 'R';
  local_4c8[0xc] = 0xffae;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0xc);
  *pmVar5 = 'S';
  local_4c8[0xb] = 0x3b;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 0xb);
  *pmVar5 = 'X';
  local_4c8[10] = 0x2f;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 10);
  *pmVar5 = 'Y';
  local_4c8[9] = 0x7e;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 9);
  *pmVar5 = 'Z';
  local_4c8[8] = 0x5b;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 8);
  *pmVar5 = '[';
  local_4c8[7] = 0x5c;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 7);
  *pmVar5 = '\\';
  local_4c8[6] = 0x5d;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 6);
  *pmVar5 = ']';
  local_4c8[5] = 0x27;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 5);
  *pmVar5 = '^';
  local_4c8[4] = 0x23;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 4);
  *pmVar5 = '_';
  local_4c8[3] = 0x3d;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 3);
  *pmVar5 = 'U';
  local_4c8[2] = 0x2c;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 2);
  *pmVar5 = 'V';
  local_4c8[1] = 0x2d;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8 + 1);
  *pmVar5 = 'W';
  local_4c8[0] = 0xffe5;
  pmVar5 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_4c8);
  *pmVar5 = '`';
  return OK;
}

Assistant:

virtual olc::rcode CreateWindowPane(const olc::vi2d &vWindowPos, olc::vi2d &vWindowSize, bool bFullScreen) override
		{
			using namespace X11;
			XInitThreads();

			// Grab the deafult display and window
			olc_Display = XOpenDisplay(NULL);
			olc_WindowRoot = DefaultRootWindow(olc_Display);

			// Based on the display capabilities, configure the appearance of the window
			GLint olc_GLAttribs[] = {GLX_RGBA, GLX_DEPTH_SIZE, 24, GLX_DOUBLEBUFFER, None};
			olc_VisualInfo = glXChooseVisual(olc_Display, 0, olc_GLAttribs);
			olc_ColourMap = XCreateColormap(olc_Display, olc_WindowRoot, olc_VisualInfo->visual, AllocNone);
			olc_SetWindowAttribs.colormap = olc_ColourMap;

			// Register which events we are interested in receiving
			olc_SetWindowAttribs.event_mask = ExposureMask | KeyPressMask | KeyReleaseMask |
											  ButtonPressMask | ButtonReleaseMask | PointerMotionMask | FocusChangeMask | StructureNotifyMask;

			// Create the window
			olc_Window = XCreateWindow(olc_Display, olc_WindowRoot, vWindowPos.x, vWindowPos.y,
									   vWindowSize.x, vWindowSize.y,
									   0, olc_VisualInfo->depth, InputOutput, olc_VisualInfo->visual,
									   CWColormap | CWEventMask, &olc_SetWindowAttribs);

			Atom wmDelete = XInternAtom(olc_Display, "WM_DELETE_WINDOW", true);
			XSetWMProtocols(olc_Display, olc_Window, &wmDelete, 1);

			XMapWindow(olc_Display, olc_Window);
			XStoreName(olc_Display, olc_Window, "OneLoneCoder.com - Pixel Game Engine");

			if (bFullScreen) // Thanks DragonEye, again :D
			{
				Atom wm_state;
				Atom fullscreen;
				wm_state = XInternAtom(olc_Display, "_NET_WM_STATE", False);
				fullscreen = XInternAtom(olc_Display, "_NET_WM_STATE_FULLSCREEN", False);
				XEvent xev{0};
				xev.type = ClientMessage;
				xev.xclient.window = olc_Window;
				xev.xclient.message_type = wm_state;
				xev.xclient.format = 32;
				xev.xclient.data.l[0] = (bFullScreen ? 1 : 0); // the action (0: off, 1: on, 2: toggle)
				xev.xclient.data.l[1] = fullscreen;			   // first property to alter
				xev.xclient.data.l[2] = 0;					   // second property to alter
				xev.xclient.data.l[3] = 0;					   // source indication
				XMapWindow(olc_Display, olc_Window);
				XSendEvent(olc_Display, DefaultRootWindow(olc_Display), False,
						   SubstructureRedirectMask | SubstructureNotifyMask, &xev);
				XFlush(olc_Display);
				XWindowAttributes gwa;
				XGetWindowAttributes(olc_Display, olc_Window, &gwa);
				vWindowSize.x = gwa.width;
				vWindowSize.y = gwa.height;
			}

			// Create Keyboard Mapping
			mapKeys[0x00] = Key::NONE;
			mapKeys[0x61] = Key::A;
			mapKeys[0x62] = Key::B;
			mapKeys[0x63] = Key::C;
			mapKeys[0x64] = Key::D;
			mapKeys[0x65] = Key::E;
			mapKeys[0x66] = Key::F;
			mapKeys[0x67] = Key::G;
			mapKeys[0x68] = Key::H;
			mapKeys[0x69] = Key::I;
			mapKeys[0x6A] = Key::J;
			mapKeys[0x6B] = Key::K;
			mapKeys[0x6C] = Key::L;
			mapKeys[0x6D] = Key::M;
			mapKeys[0x6E] = Key::N;
			mapKeys[0x6F] = Key::O;
			mapKeys[0x70] = Key::P;
			mapKeys[0x71] = Key::Q;
			mapKeys[0x72] = Key::R;
			mapKeys[0x73] = Key::S;
			mapKeys[0x74] = Key::T;
			mapKeys[0x75] = Key::U;
			mapKeys[0x76] = Key::V;
			mapKeys[0x77] = Key::W;
			mapKeys[0x78] = Key::X;
			mapKeys[0x79] = Key::Y;
			mapKeys[0x7A] = Key::Z;

			mapKeys[XK_F1] = Key::F1;
			mapKeys[XK_F2] = Key::F2;
			mapKeys[XK_F3] = Key::F3;
			mapKeys[XK_F4] = Key::F4;
			mapKeys[XK_F5] = Key::F5;
			mapKeys[XK_F6] = Key::F6;
			mapKeys[XK_F7] = Key::F7;
			mapKeys[XK_F8] = Key::F8;
			mapKeys[XK_F9] = Key::F9;
			mapKeys[XK_F10] = Key::F10;
			mapKeys[XK_F11] = Key::F11;
			mapKeys[XK_F12] = Key::F12;

			mapKeys[XK_Down] = Key::DOWN;
			mapKeys[XK_Left] = Key::LEFT;
			mapKeys[XK_Right] = Key::RIGHT;
			mapKeys[XK_Up] = Key::UP;
			mapKeys[XK_KP_Enter] = Key::ENTER;
			mapKeys[XK_Return] = Key::ENTER;

			mapKeys[XK_BackSpace] = Key::BACK;
			mapKeys[XK_Escape] = Key::ESCAPE;
			mapKeys[XK_Linefeed] = Key::ENTER;
			mapKeys[XK_Pause] = Key::PAUSE;
			mapKeys[XK_Scroll_Lock] = Key::SCROLL;
			mapKeys[XK_Tab] = Key::TAB;
			mapKeys[XK_Delete] = Key::DEL;
			mapKeys[XK_Home] = Key::HOME;
			mapKeys[XK_End] = Key::END;
			mapKeys[XK_Page_Up] = Key::PGUP;
			mapKeys[XK_Page_Down] = Key::PGDN;
			mapKeys[XK_Insert] = Key::INS;
			mapKeys[XK_Shift_L] = Key::SHIFT;
			mapKeys[XK_Shift_R] = Key::SHIFT;
			mapKeys[XK_Control_L] = Key::CTRL;
			mapKeys[XK_Control_R] = Key::CTRL;
			mapKeys[XK_space] = Key::SPACE;
			mapKeys[XK_period] = Key::PERIOD;

			mapKeys[XK_0] = Key::K0;
			mapKeys[XK_1] = Key::K1;
			mapKeys[XK_2] = Key::K2;
			mapKeys[XK_3] = Key::K3;
			mapKeys[XK_4] = Key::K4;
			mapKeys[XK_5] = Key::K5;
			mapKeys[XK_6] = Key::K6;
			mapKeys[XK_7] = Key::K7;
			mapKeys[XK_8] = Key::K8;
			mapKeys[XK_9] = Key::K9;

			mapKeys[XK_KP_0] = Key::NP0;
			mapKeys[XK_KP_1] = Key::NP1;
			mapKeys[XK_KP_2] = Key::NP2;
			mapKeys[XK_KP_3] = Key::NP3;
			mapKeys[XK_KP_4] = Key::NP4;
			mapKeys[XK_KP_5] = Key::NP5;
			mapKeys[XK_KP_6] = Key::NP6;
			mapKeys[XK_KP_7] = Key::NP7;
			mapKeys[XK_KP_8] = Key::NP8;
			mapKeys[XK_KP_9] = Key::NP9;
			mapKeys[XK_KP_Multiply] = Key::NP_MUL;
			mapKeys[XK_KP_Add] = Key::NP_ADD;
			mapKeys[XK_KP_Divide] = Key::NP_DIV;
			mapKeys[XK_KP_Subtract] = Key::NP_SUB;
			mapKeys[XK_KP_Decimal] = Key::NP_DECIMAL;

			// These keys vary depending on the keyboard. I've included comments for US and UK keyboard layouts
			mapKeys[XK_semicolon] = Key::OEM_1;	   // On US and UK keyboards this is the ';:' key
			mapKeys[XK_slash] = Key::OEM_2;		   // On US and UK keyboards this is the '/?' key
			mapKeys[XK_asciitilde] = Key::OEM_3;   // On US keyboard this is the '~' key
			mapKeys[XK_bracketleft] = Key::OEM_4;  // On US and UK keyboards this is the '[{' key
			mapKeys[XK_backslash] = Key::OEM_5;	   // On US keyboard this is '\|' key.
			mapKeys[XK_bracketright] = Key::OEM_6; // On US and UK keyboards this is the ']}' key
			mapKeys[XK_apostrophe] = Key::OEM_7;   // On US keyboard this is the single/double quote key. On UK, this is the single quote/@ symbol key
			mapKeys[XK_numbersign] = Key::OEM_8;   // miscellaneous characters. Varies by keyboard. I believe this to be the '#~' key on UK keyboards
			mapKeys[XK_equal] = Key::EQUALS;	   // the '+' key on any keyboard
			mapKeys[XK_comma] = Key::COMMA;		   // the comma key on any keyboard
			mapKeys[XK_minus] = Key::MINUS;		   // the minus key on any keyboard

			mapKeys[XK_Caps_Lock] = Key::CAPS_LOCK;

			return olc::OK;
		}